

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Target.hpp
# Opt level: O0

void __thiscall Analyser::Static::AmstradCPC::Target::Target(Target *this)

{
  bool bVar1;
  allocator<char> local_41;
  string local_40;
  Target *local_10;
  Target *this_local;
  
  local_10 = this;
  Static::Target::Target(&this->super_Target,AmstradCPC);
  Reflection::StructImpl<Analyser::Static::AmstradCPC::Target>::StructImpl
            (&this->super_StructImpl<Analyser::Static::AmstradCPC::Target>);
  (this->super_Target)._vptr_Target = (_func_int **)&PTR__Target_00c93c30;
  (this->super_StructImpl<Analyser::Static::AmstradCPC::Target>).super_Struct._vptr_Struct =
       (_func_int **)&DAT_00c93c50;
  this->model = CPC464;
  std::__cxx11::string::string((string *)&this->loading_command);
  bVar1 = Reflection::StructImpl<Analyser::Static::AmstradCPC::Target>::needs_declare
                    (&this->super_StructImpl<Analyser::Static::AmstradCPC::Target>);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"model",&local_41);
    Reflection::StructImpl<Analyser::Static::AmstradCPC::Target>::
    declare<Analyser::Static::AmstradCPC::Target::Model>
              (&this->super_StructImpl<Analyser::Static::AmstradCPC::Target>,&this->model,&local_40)
    ;
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    Reflection::Enum::declare<Analyser::Static::AmstradCPC::Target::Model>
              ("Model","CPC464, CPC664, CPC6128");
  }
  return;
}

Assistant:

Target() : Analyser::Static::Target(Machine::AmstradCPC) {
		if(needs_declare()) {
			DeclareField(model);
			AnnounceEnum(Model);
		}
	}